

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type __thiscall
fmt::v5::
visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
          (v5 *this,
          arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
          *vis,basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
               *arg)

{
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *extraout_RDX;
  type tVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  type tVar5;
  type tVar6;
  type tVar7;
  type tVar8;
  type tVar9;
  type tVar10;
  type tVar12;
  type tVar13;
  iterator iVar11;
  
  switch(*(undefined4 *)
          &(vis->
           super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           ).writer_.locale_.locale_) {
  case 2:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(int)(vis->
                                      super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                      ).writer_.out_.count_);
    tVar1.count_ = tVar6.count_;
    tVar1.blackhole_ = tVar6.blackhole_;
    tVar1._9_7_ = tVar6._9_7_;
    return tVar1;
  case 3:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(uint)(vis->
                                       super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                       ).writer_.out_.count_);
    tVar8.count_ = tVar6.count_;
    tVar8.blackhole_ = tVar6.blackhole_;
    tVar8._9_7_ = tVar6._9_7_;
    return tVar8;
  case 4:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(vis->
                                 super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                 ).writer_.out_.count_);
    tVar4.count_ = tVar6.count_;
    tVar4.blackhole_ = tVar6.blackhole_;
    tVar4._9_7_ = tVar6._9_7_;
    return tVar4;
  case 5:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(vis->
                                 super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                 ).writer_.out_.count_);
    tVar5.count_ = tVar6.count_;
    tVar5.blackhole_ = tVar6.blackhole_;
    tVar5._9_7_ = tVar6._9_7_;
    return tVar5;
  case 6:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(int)(vis->
                                      super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                      ).writer_.out_.count_ != 0);
    tVar2.count_ = tVar6.count_;
    tVar2.blackhole_ = tVar6.blackhole_;
    tVar2._9_7_ = tVar6._9_7_;
    return tVar2;
  case 7:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(char)(vis->
                                       super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                       ).writer_.out_.count_);
    tVar9.count_ = tVar6.count_;
    tVar9.blackhole_ = tVar6.blackhole_;
    tVar9._9_7_ = tVar6._9_7_;
    return tVar9;
  case 8:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,(double)(vis->
                                         super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                         ).writer_.out_.count_);
    tVar10.count_ = tVar6.count_;
    tVar10.blackhole_ = tVar6.blackhole_;
    tVar10._9_7_ = tVar6._9_7_;
    return tVar10;
  case 9:
    tVar6 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                          *)this,*(longdouble *)
                                  &(vis->
                                   super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                   ).writer_.out_);
    break;
  case 10:
    iVar11 = internal::
             arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
             ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                           *)this,(char_type *)
                                  (vis->
                                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                  ).writer_.out_.count_);
    tVar13.count_ = iVar11.count_;
    tVar13.blackhole_ = iVar11.blackhole_;
    tVar13._9_7_ = iVar11._9_7_;
    return tVar13;
  case 0xb:
    iVar11 = internal::
             arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
             ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                           *)this,(basic_string_view<char>)
                                  (vis->
                                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                  ).writer_.out_);
    tVar3.count_ = iVar11.count_;
    tVar3.blackhole_ = iVar11.blackhole_;
    tVar3._9_7_ = iVar11._9_7_;
    return tVar3;
  case 0xc:
    iVar11 = internal::
             arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
             ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                           *)this,(void *)(vis->
                                          super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                                          ).writer_.out_.count_);
    tVar12.count_ = iVar11.count_;
    tVar12.blackhole_ = iVar11.blackhole_;
    tVar12._9_7_ = iVar11._9_7_;
    return tVar12;
  case 0xd:
    (**(code **)&(vis->
                 super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                 ).writer_.out_.blackhole_)
              ((vis->
               super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
               ).writer_.out_.count_,*(undefined8 *)(this + 0x20));
    arg = extraout_RDX;
  default:
    tVar6._9_7_ = (int7)((ulong)arg >> 8);
    tVar6.blackhole_ = (char)this[8];
    tVar6.count_ = *(size_t *)this;
  }
  tVar7.count_ = tVar6.count_;
  tVar7.blackhole_ = tVar6.blackhole_;
  tVar7._9_7_ = tVar6._9_7_;
  return tVar7;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}